

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O0

uint luaS_hashlongstr(TString *ts)

{
  uint uVar1;
  size_t len;
  TString *ts_local;
  
  if (ts->extra == '\0') {
    uVar1 = luaS_hash(ts->contents,(ts->u).lnglen,ts->hash);
    ts->hash = uVar1;
    ts->extra = '\x01';
  }
  return ts->hash;
}

Assistant:

unsigned int luaS_hashlongstr (TString *ts) {
  lua_assert(ts->tt == LUA_VLNGSTR);
  if (ts->extra == 0) {  /* no hash? */
    size_t len = ts->u.lnglen;
    ts->hash = luaS_hash(getstr(ts), len, ts->hash);
    ts->extra = 1;  /* now it has its hash */
  }
  return ts->hash;
}